

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O0

void __thiscall
RVO::RVOSimulator::setAgentDefaults
          (RVOSimulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,
          float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  Agent *this_00;
  Vector2 *velocity_local;
  float maxSpeed_local;
  float radius_local;
  float timeHorizonObst_local;
  float timeHorizon_local;
  size_t maxNeighbors_local;
  float neighborDist_local;
  RVOSimulator *this_local;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    this_00 = (Agent *)operator_new(0x98);
    Agent::Agent(this_00,this);
    this->defaultAgent_ = this_00;
  }
  this->defaultAgent_->maxNeighbors_ = maxNeighbors;
  this->defaultAgent_->maxSpeed_ = maxSpeed;
  this->defaultAgent_->neighborDist_ = neighborDist;
  this->defaultAgent_->radius_ = radius;
  this->defaultAgent_->timeHorizon_ = timeHorizon;
  this->defaultAgent_->timeHorizonObst_ = timeHorizonObst;
  this->defaultAgent_->velocity_ = *velocity;
  return;
}

Assistant:

void RVOSimulator::setAgentDefaults(float neighborDist, size_t maxNeighbors, float timeHorizon, float timeHorizonObst, float radius, float maxSpeed, const Vector2 &velocity)
	{
		if (defaultAgent_ == NULL) {
			defaultAgent_ = new Agent(this);
		}

		defaultAgent_->maxNeighbors_ = maxNeighbors;
		defaultAgent_->maxSpeed_ = maxSpeed;
		defaultAgent_->neighborDist_ = neighborDist;
		defaultAgent_->radius_ = radius;
		defaultAgent_->timeHorizon_ = timeHorizon;
		defaultAgent_->timeHorizonObst_ = timeHorizonObst;
		defaultAgent_->velocity_ = velocity;
	}